

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

bool __thiscall QTextFragment::contains(QTextFragment *this,int position)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long *in_RDI;
  int pos;
  QTextFragment *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffdc;
  bool local_1;
  
  if ((*in_RDI == 0) || ((int)in_RDI[1] == 0)) {
    local_1 = false;
  }
  else {
    iVar1 = QTextFragment::position(in_stack_ffffffffffffffc8);
    local_1 = false;
    if (iVar1 <= in_ESI) {
      iVar2 = length((QTextFragment *)
                     (CONCAT44(in_stack_ffffffffffffffdc,in_ESI) & 0xffffffffffffff));
      local_1 = in_ESI < iVar1 + iVar2;
    }
  }
  return local_1;
}

Assistant:

bool QTextFragment::contains(int position) const
{
    if (!p || !n)
        return false;
    int pos = this->position();
    return position >= pos && position < pos + length();
}